

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcPolyline::IfcPolyline(IfcPolyline *this)

{
  *(undefined ***)&this->field_0x68 = &PTR__Object_007a99b0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(char **)&this->field_0x78 = "IfcPolyline";
  IfcBoundedCurve::IfcBoundedCurve
            (&this->super_IfcBoundedCurve,&PTR_construction_vtable_24__007ea8b8);
  *(undefined8 *)&(this->super_IfcBoundedCurve).field_0x48 = 0;
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7ea7d8;
  *(undefined8 *)&this->field_0x68 = 0x7ea8a0;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7ea800;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7ea828;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 =
       0x7ea850;
  *(undefined8 *)&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 = 0x7ea878;
  *(undefined8 *)&(this->super_IfcBoundedCurve).field_0x50 = 0;
  *(undefined8 *)&this->field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  return;
}

Assistant:

IfcPolyline() : Object("IfcPolyline") {}